

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ReferencedByGeometryShaderCase::iterate
          (ReferencedByGeometryShaderCase *this)

{
  bool *pbVar1;
  ostringstream *poVar2;
  RenderContext *renderCtx;
  TestLog *pTVar3;
  int iVar4;
  GLuint GVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  CallLogWrapper gl;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  GLsizei length;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  GLint referenced;
  undefined4 uStack_37c;
  size_type local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  deUint32 props [1];
  undefined4 uStack_35c;
  size_type local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  ScopedLogSection section;
  value_type local_338;
  undefined1 local_318 [8];
  value_type local_310;
  ContextType local_2ec;
  ContextType local_2e8;
  ContextType local_2e4;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270 [6];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  ShaderProgram program;
  
  tcu::TestContext::setTestResult
            ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  renderCtx = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx;
  local_1d0[0x10] = 0;
  local_1d0._17_8_ = 0;
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0[8] = 0;
  local_1d0._9_7_ = 0;
  memset(local_280,0,0xac);
  _length = (pointer)&local_390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&length,
             "${GLSL_VERSION_DECL}\nuniform highp vec4 u_position;\nvoid main (void)\n{\n\tgl_Position = u_position;\n}\n"
             ,"");
  local_2e4.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->
                  m_renderCtx->_vptr_RenderContext[2])();
  specializeShader((string *)props,(string *)&length,&local_2e4);
  gl.m_gl = (Functions *)((ulong)gl.m_gl._4_4_ << 0x20);
  gl.m_log = (TestLog *)&local_3b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&gl.m_log,CONCAT44(uStack_35c,props[0]),
             local_358 + CONCAT44(uStack_35c,props[0]));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + ((ulong)gl.m_gl & 0xffffffff) * 0x18),(value_type *)&gl.m_log);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a0,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
             ,"");
  local_2e8.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->
                  m_renderCtx->_vptr_RenderContext[2])();
  specializeShader((string *)&referenced,&local_2a0,&local_2e8);
  local_318._0_4_ = 1;
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,CONCAT44(uStack_37c,referenced),
             local_378 + CONCAT44(uStack_37c,referenced));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + ((ulong)local_318 & 0xffffffff) * 0x18),&local_310);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,
             "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(points) in;\nlayout(points, max_vertices=1) out;\nuniform highp vec4 u_offset;\nvoid main (void)\n{\n\tgl_Position = gl_in[0].gl_Position + u_offset;\n\tEmitVertex();\n}\n"
             ,"");
  local_2ec.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->
                  m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_2c0,&local_2e0,&local_2ec);
  section.m_log._0_4_ = 2;
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_338,local_2c0._M_dataplus._M_p,
             local_2c0._M_dataplus._M_p + local_2c0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + (ulong)(uint)section.m_log * 0x18),&local_338);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(uStack_37c,referenced) != &local_370) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(uStack_37c,referenced),local_370._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gl.m_log != &local_3b0) {
    operator_delete(gl.m_log,local_3b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(uStack_35c,props[0]) != &local_350) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(uStack_35c,props[0]),local_350._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_length != &local_390) {
    operator_delete(_length,local_390._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar7 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  glu::operator<<(((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log,&program);
  pTVar3 = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  local_280._0_8_ = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"UnreferencedUniform","");
  pbVar1 = &gl.m_enableLog;
  gl.m_gl = (Functions *)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gl,"Unreferenced uniform u_position","");
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar3,(string *)local_280,(string *)&gl);
  if (gl.m_gl != (Functions *)pbVar1) {
    operator_delete(gl.m_gl,CONCAT71(gl._17_7_,gl.m_enableLog) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._0_8_ != local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270[0]._M_allocated_capacity + 1));
  }
  iVar4 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
  props[0] = 0x9309;
  _length = _length & 0xffffffff00000000;
  referenced = 0;
  gl.m_enableLog = true;
  GVar5 = glu::CallLogWrapper::glGetProgramResourceIndex
                    (&gl,program.m_program.m_program,0x92e1,"u_position");
  local_280._0_8_ =
       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_280 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"u_position resource index: ",0x1b);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_208);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&gl,program.m_program.m_program,0x92e1,GVar5,1,props,1,&length,&referenced);
  local_280._0_8_ =
       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_280 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Query GL_REFERENCED_BY_GEOMETRY_SHADER, got ",0x2c);
  std::ostream::operator<<(poVar2,length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2," value(s), value[0] = ",0x16);
  local_318 = (undefined1  [8])glu::getBooleanName;
  local_310._M_dataplus._M_p._0_4_ = referenced;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_318,(ostream *)poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_208);
  GVar6 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar6,"query resource",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x14a4);
  if ((length == 0) || (referenced != 0)) {
    local_280._0_8_ =
         ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_280 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Error, expected GL_FALSE.",0x19);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_208);
    tcu::TestContext::setTestResult
              ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"got unexpected value");
  }
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  tcu::TestLog::endSection((TestLog *)CONCAT44(section.m_log._4_4_,(uint)section.m_log));
  pTVar3 = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  local_280._0_8_ = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"ReferencedUniform","");
  gl.m_gl = (Functions *)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gl,"Referenced uniform u_offset","");
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar3,(string *)local_280,(string *)&gl);
  if (gl.m_gl != (Functions *)pbVar1) {
    operator_delete(gl.m_gl,CONCAT71(gl._17_7_,gl.m_enableLog) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._0_8_ != local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270[0]._M_allocated_capacity + 1));
  }
  iVar4 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var_00,iVar4),
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
  props[0] = 0x9309;
  _length = _length & 0xffffffff00000000;
  referenced = 0;
  gl.m_enableLog = true;
  GVar5 = glu::CallLogWrapper::glGetProgramResourceIndex
                    (&gl,program.m_program.m_program,0x92e1,"u_offset");
  local_280._0_8_ =
       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_280 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"u_offset resource index: ",0x19);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_208);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&gl,program.m_program.m_program,0x92e1,GVar5,1,props,1,&length,&referenced);
  local_280._0_8_ =
       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_280 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"Query GL_REFERENCED_BY_GEOMETRY_SHADER, got ",0x2c);
  std::ostream::operator<<(poVar2,length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2," value(s), value[0] = ",0x16);
  local_318 = (undefined1  [8])glu::getBooleanName;
  local_310._M_dataplus._M_p._0_4_ = referenced;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_318,(ostream *)poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_208);
  GVar6 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar6,"query resource",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x14bd);
  if ((length == 0) || (referenced != 1)) {
    local_280._0_8_ =
         ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_280 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Error, expected GL_TRUE.",0x18);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_208);
    tcu::TestContext::setTestResult
              ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"got unexpected value");
  }
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  tcu::TestLog::endSection((TestLog *)CONCAT44(section.m_log._4_4_,(uint)section.m_log));
  glu::ShaderProgram::~ShaderProgram(&program);
  return STOP;
}

Assistant:

ReferencedByGeometryShaderCase::IterateResult ReferencedByGeometryShaderCase::iterate (void)
{
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	{
		static const char* const vertexSource =		"${GLSL_VERSION_DECL}\n"
													"uniform highp vec4 u_position;\n"
													"void main (void)\n"
													"{\n"
													"	gl_Position = u_position;\n"
													"}\n";
		static const char* const fragmentSource =	"${GLSL_VERSION_DECL}\n"
													"layout(location = 0) out mediump vec4 fragColor;\n"
													"void main (void)\n"
													"{\n"
													"	fragColor = vec4(1.0, 1.0, 1.0, 1.0);\n"
													"}\n";
		static const char* const geometrySource =	"${GLSL_VERSION_DECL}\n"
													"${GLSL_EXT_GEOMETRY_SHADER}"
													"layout(points) in;\n"
													"layout(points, max_vertices=1) out;\n"
													"uniform highp vec4 u_offset;\n"
													"void main (void)\n"
													"{\n"
													"	gl_Position = gl_in[0].gl_Position + u_offset;\n"
													"	EmitVertex();\n"
													"}\n";

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::ProgramSources()
																		<< glu::VertexSource(specializeShader(vertexSource, m_context.getRenderContext().getType()))
																		<< glu::FragmentSource(specializeShader(fragmentSource, m_context.getRenderContext().getType()))
																		<< glu::GeometrySource(specializeShader(geometrySource, m_context.getRenderContext().getType())));
		m_testCtx.getLog() << program;

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "UnreferencedUniform", "Unreferenced uniform u_position");
			glu::CallLogWrapper			gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
			const deUint32				props[1]	= { GL_REFERENCED_BY_GEOMETRY_SHADER };
			deUint32					resourcePos;
			glw::GLsizei				length		= 0;
			glw::GLint					referenced	= 0;

			gl.enableLogging(true);

			resourcePos = gl.glGetProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_position");
			m_testCtx.getLog() << tcu::TestLog::Message << "u_position resource index: " << resourcePos << tcu::TestLog::EndMessage;

			gl.glGetProgramResourceiv(program.getProgram(), GL_UNIFORM, resourcePos, 1, props, 1, &length, &referenced);
			m_testCtx.getLog() << tcu::TestLog::Message << "Query GL_REFERENCED_BY_GEOMETRY_SHADER, got " << length << " value(s), value[0] = " << glu::getBooleanStr(referenced) << tcu::TestLog::EndMessage;

			GLU_EXPECT_NO_ERROR(gl.glGetError(), "query resource");

			if (length == 0 || referenced != GL_FALSE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected GL_FALSE." << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected value");
			}
		}

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "ReferencedUniform", "Referenced uniform u_offset");
			glu::CallLogWrapper			gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
			const deUint32				props[1]	= { GL_REFERENCED_BY_GEOMETRY_SHADER };
			deUint32					resourcePos;
			glw::GLsizei				length		= 0;
			glw::GLint					referenced	= 0;

			gl.enableLogging(true);

			resourcePos = gl.glGetProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_offset");
			m_testCtx.getLog() << tcu::TestLog::Message << "u_offset resource index: " << resourcePos << tcu::TestLog::EndMessage;

			gl.glGetProgramResourceiv(program.getProgram(), GL_UNIFORM, resourcePos, 1, props, 1, &length, &referenced);
			m_testCtx.getLog() << tcu::TestLog::Message << "Query GL_REFERENCED_BY_GEOMETRY_SHADER, got " << length << " value(s), value[0] = " << glu::getBooleanStr(referenced) << tcu::TestLog::EndMessage;

			GLU_EXPECT_NO_ERROR(gl.glGetError(), "query resource");

			if (length == 0 || referenced != GL_TRUE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected GL_TRUE." << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected value");
			}
		}
	}

	return STOP;
}